

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_common.c
# Opt level: O1

LY_ERR lysp_ext_instance_resolve_argument(ly_ctx *ctx,lysp_ext_instance *ext_p)

{
  byte *pbVar1;
  lysp_ext *plVar2;
  bool bVar3;
  int iVar4;
  LY_ERR LVar5;
  lys_module *plVar6;
  lys_module *plVar7;
  lysp_stmt *plVar8;
  char *pcVar9;
  size_t prefix_arg_len;
  size_t name_arg_len;
  char *prefix_arg;
  char *name_arg;
  size_t prefix_ext_len;
  size_t name_ext_len;
  char *prefix_ext;
  char *name_ext;
  char *ext;
  char *arg;
  
  plVar2 = ext_p->def;
  if (plVar2 == (lysp_ext *)0x0) {
    __assert_fail("ext_p->def",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_schema_common.c"
                  ,0x848,
                  "LY_ERR lysp_ext_instance_resolve_argument(struct ly_ctx *, struct lysp_ext_instance *)"
                 );
  }
  pcVar9 = plVar2->argname;
  LVar5 = LY_SUCCESS;
  if ((pcVar9 != (char *)0x0) && (LVar5 = LY_SUCCESS, ext_p->argument == (char *)0x0)) {
    if (ext_p->format == LY_VALUE_XML) {
      plVar8 = ext_p->child;
      if ((plVar2->flags & 0x80) == 0) {
        for (; plVar8 != (lysp_stmt *)0x0; plVar8 = plVar8->next) {
          if (((plVar8->flags & 0x400) == 0) || (iVar4 = strcmp(plVar8->stmt,pcVar9), iVar4 == 0))
          goto LAB_001663df;
        }
      }
      else {
        for (; plVar8 != (lysp_stmt *)0x0; plVar8 = plVar8->next) {
          if ((plVar8->flags & 0x400) == 0) {
            plVar8 = ext_p->child;
            arg = plVar8->stmt;
            ly_parse_nodeid(&arg,&prefix_arg,&prefix_arg_len,&name_arg,&name_arg_len);
            iVar4 = ly_strncmp(ext_p->def->argname,name_arg,
                               CONCAT44(name_arg_len._4_4_,(uint)name_arg_len));
            if (iVar4 == 0) {
              ext = ext_p->name;
              ly_parse_nodeid(&ext,&prefix_ext,&prefix_ext_len,&name_ext,&name_ext_len);
              plVar6 = ly_resolve_prefix(ctx,prefix_ext,prefix_ext_len,ext_p->format,
                                         ext_p->prefix_data);
              plVar7 = ly_resolve_prefix(ctx,prefix_arg,prefix_arg_len,plVar8->format,
                                         plVar8->prefix_data);
              if (plVar6 == plVar7) goto LAB_001663df;
              ly_vlog(ctx,(char *)0x0,LYVE_SEMANTICS,
                      "Extension instance \"%s\" element and its argument element \"%s\" are expected in the same namespace, but they differ."
                      ,ext_p->name,ext_p->def->argname);
            }
            else {
              ly_vlog(ctx,(char *)0x0,LYVE_SEMANTICS,
                      "Extension instance \"%s\" expects argument element \"%s\" as its first XML child, but \"%.*s\" element found."
                      ,ext_p->name,ext_p->def->argname,(ulong)(uint)name_arg_len,name_arg);
            }
            LVar5 = LY_EVALID;
            goto LAB_00166528;
          }
        }
      }
      plVar8 = (lysp_stmt *)0x0;
LAB_001663df:
      bVar3 = true;
      if (plVar8 == (lysp_stmt *)0x0) {
        LVar5 = LY_EVALID;
      }
      else {
        LVar5 = lydict_insert(ctx,plVar8->arg,0,&ext_p->argument);
        if (LVar5 == LY_SUCCESS) {
          pbVar1 = (byte *)((long)&plVar8->flags + 1);
          *pbVar1 = *pbVar1 | 8;
          LVar5 = LY_EVALID;
        }
        else {
LAB_00166528:
          bVar3 = false;
        }
      }
      if (!bVar3) {
        return LVar5;
      }
    }
    LVar5 = LY_SUCCESS;
    if (ext_p->argument == (char *)0x0) {
      pcVar9 = "element ";
      if (-1 < (char)ext_p->def->flags) {
        pcVar9 = "";
      }
      ly_vlog(ctx,(char *)0x0,LYVE_SEMANTICS,"Extension instance \"%s\" missing argument %s\"%s\".",
              ext_p->name,pcVar9,ext_p->def->argname);
      LVar5 = LY_EVALID;
    }
  }
  return LVar5;
}

Assistant:

LY_ERR
lysp_ext_instance_resolve_argument(struct ly_ctx *ctx, struct lysp_ext_instance *ext_p)
{
    assert(ext_p->def);

    if (!ext_p->def->argname || ext_p->argument) {
        /* nothing to do */
        return LY_SUCCESS;
    }

    if (ext_p->format == LY_VALUE_XML) {
        /* schema was parsed from YIN and an argument is expected, ... */
        struct lysp_stmt *stmt = NULL;

        if (ext_p->def->flags & LYS_YINELEM_TRUE) {
            /* ... argument was the first XML child element */
            for (stmt = ext_p->child; stmt && (stmt->flags & LYS_YIN_ATTR); stmt = stmt->next) {}
            if (stmt) {
                const char *arg, *ext, *name_arg, *name_ext, *prefix_arg, *prefix_ext;
                size_t name_arg_len, name_ext_len, prefix_arg_len, prefix_ext_len;

                stmt = ext_p->child;

                arg = stmt->stmt;
                ly_parse_nodeid(&arg, &prefix_arg, &prefix_arg_len, &name_arg, &name_arg_len);
                if (ly_strncmp(ext_p->def->argname, name_arg, name_arg_len)) {
                    LOGVAL(ctx, LYVE_SEMANTICS, "Extension instance \"%s\" expects argument element \"%s\" as its first XML child, "
                            "but \"%.*s\" element found.", ext_p->name, ext_p->def->argname, (int)name_arg_len, name_arg);
                    return LY_EVALID;
                }

                /* check namespace - all the extension instances must be qualified and argument element is expected in the same
                 * namespace. Do not check just prefixes, there can be different prefixes pointing to the same namespace */
                ext = ext_p->name; /* include prefix */
                ly_parse_nodeid(&ext, &prefix_ext, &prefix_ext_len, &name_ext, &name_ext_len);

                if (ly_resolve_prefix(ctx, prefix_ext, prefix_ext_len, ext_p->format, ext_p->prefix_data) !=
                        ly_resolve_prefix(ctx, prefix_arg, prefix_arg_len, stmt->format, stmt->prefix_data)) {
                    LOGVAL(ctx, LYVE_SEMANTICS, "Extension instance \"%s\" element and its argument element \"%s\" are "
                            "expected in the same namespace, but they differ.", ext_p->name, ext_p->def->argname);
                    return LY_EVALID;
                }
            }
        } else {
            /* ... argument was one of the XML attributes which are represented as child stmt with LYS_YIN_ATTR flag */
            for (stmt = ext_p->child; stmt && (stmt->flags & LYS_YIN_ATTR); stmt = stmt->next) {
                if (!strcmp(stmt->stmt, ext_p->def->argname)) {
                    /* this is the extension's argument */
                    break;
                }
            }
        }

        if (stmt) {
            LY_CHECK_RET(lydict_insert(ctx, stmt->arg, 0, &ext_p->argument));
            stmt->flags |= LYS_YIN_ARGUMENT;
        }
    }

    if (!ext_p->argument) {
        /* missing extension's argument */
        LOGVAL(ctx, LYVE_SEMANTICS, "Extension instance \"%s\" missing argument %s\"%s\".",
                ext_p->name, (ext_p->def->flags & LYS_YINELEM_TRUE) ? "element " : "", ext_p->def->argname);
        return LY_EVALID;
    }

    return LY_SUCCESS;
}